

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O1

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree(KDTree<phosg::Vector2<long>,_long> *this)

{
  Node *pNVar1;
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  to_delete;
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  local_68;
  
  local_68._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::_M_initialize_map(&local_68,0);
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
  ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
            ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
              *)&local_68,&this->root);
  if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_68._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pNVar1 = *local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_68._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_68._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_68._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_68._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_68._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_68._M_impl.super__Deque_impl_data._M_start._M_last =
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_68._M_impl.super__Deque_impl_data._M_start._M_first =
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_68._M_impl.super__Deque_impl_data._M_start._M_node =
             local_68._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_68._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if (pNVar1->before != (Node *)0x0) {
        ::std::
        deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
        ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                  ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                    *)&local_68,&pNVar1->before);
      }
      if (pNVar1->after_or_equal != (Node *)0x0) {
        ::std::
        deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
        ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                  ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                    *)&local_68,&pNVar1->after_or_equal);
      }
      if (pNVar1 != (Node *)0x0) {
        operator_delete(pNVar1,0x38);
      }
    } while (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ::std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base(&local_68);
  return;
}

Assistant:

KDTree<CoordType, ValueType>::~KDTree() {
  std::deque<Node*> to_delete;
  to_delete.emplace_back(this->root);
  while (!to_delete.empty()) {
    Node* n = to_delete.front();
    to_delete.pop_front();

    if (n->before) {
      to_delete.emplace_back(n->before);
    }
    if (n->after_or_equal) {
      to_delete.emplace_back(n->after_or_equal);
    }
    delete n;
  }
}